

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultGame.h
# Opt level: O0

void __thiscall TgBot::InlineQueryResultGame::InlineQueryResultGame(InlineQueryResultGame *this)

{
  InlineQueryResultGame *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultGame_0051b178;
  std::__cxx11::string::string((string *)&this->gameShortName);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  return;
}

Assistant:

InlineQueryResultGame() {
        this->type = TYPE;
    }